

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

SoapySDRArgInfo *
SoapySDRDevice_getChannelSensorInfo(SoapySDRDevice *device,int direction,size_t channel,char *key)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  long *in_RSI;
  ArgInfo *in_RDI;
  char *in_R8;
  exception *ex;
  allocator local_131;
  string local_130 [32];
  ArgInfo *in_stack_fffffffffffffef0;
  
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,in_R8,&local_131);
  (**(code **)(*in_RSI + 0x2d8))(&stack0xfffffffffffffef0,in_RSI,in_EDX,in_RCX,local_130);
  toArgInfo(in_stack_fffffffffffffef0);
  SoapySDR::ArgInfo::~ArgInfo(in_RDI);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  return (SoapySDRArgInfo *)in_RDI;
}

Assistant:

SoapySDRArgInfo SoapySDRDevice_getChannelSensorInfo(const SoapySDRDevice *device, const int direction, const size_t channel, const char *key)
{
    __SOAPY_SDR_C_TRY
    return toArgInfo(device->getSensorInfo(direction, channel, key));
    __SOAPY_SDR_C_CATCH_RET(SoapySDRArgInfoNull());
}